

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

int query_category(char *qstr,obj *olist,int qflags,int *pick_list,int how)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  int iVar12;
  char *pack;
  long lVar13;
  char *pcVar14;
  obj *poVar15;
  long lVar16;
  obj *poVar17;
  char *pcVar18;
  nh_menuitem *pnVar19;
  ulong uVar20;
  byte bVar21;
  bool bVar22;
  char cVar23;
  int ccount;
  int *results;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  menulist menu;
  int valid_oclasses [18];
  char buf [256];
  menulist local_1c8;
  bool local_1b2;
  bool local_1b1;
  bool local_1b0;
  char local_1af;
  char local_1ae;
  char local_1ad;
  int local_1ac;
  obj *local_1a8;
  int local_19c;
  int *local_198;
  char *local_190;
  int local_188 [20];
  char local_138 [264];
  
  if (olist == (obj *)0x0) {
LAB_00212d5c:
    uVar25 = 0;
  }
  else {
    bVar27 = true;
    local_1b2 = true;
    local_1a8 = olist;
    if ((qflags & 2U) != 0) {
      iVar12 = count_unpaid(olist);
      local_1b2 = iVar12 == 0;
    }
    bVar21 = false;
    if ((char)qflags < '\0') {
      iVar12 = count_buc(local_1a8,0x80);
      bVar27 = iVar12 == 0;
      bVar21 = !bVar27;
    }
    bVar22 = true;
    local_1ae = bVar27;
    if (((uint)qflags >> 8 & 1) == 0) {
      local_1b1 = true;
    }
    else {
      iVar12 = count_buc(local_1a8,0x100);
      local_1b1 = iVar12 == 0;
      bVar21 = bVar21 + !local_1b1;
    }
    if (((uint)qflags >> 9 & 1) != 0) {
      iVar12 = count_buc(local_1a8,0x200);
      bVar22 = iVar12 == 0;
      bVar21 = bVar21 + !bVar22;
    }
    local_1af = '\x01';
    if (((uint)qflags >> 10 & 1) == 0) {
      local_1b0 = true;
    }
    else {
      iVar12 = count_buc(local_1a8,0x400);
      local_1b0 = iVar12 == 0;
      bVar21 = bVar21 + !local_1b0;
    }
    poVar17 = local_1a8;
    local_1ad = bVar22;
    local_19c = how;
    local_198 = pick_list;
    local_190 = qstr;
    if (((uint)qflags >> 0xb & 1) != 0) {
      iVar12 = count_buc(local_1a8,0x800);
      local_1af = iVar12 == 0;
    }
    uVar26 = (ulong)(qflags * 8 & 8);
    lVar13 = 0x319620;
    iVar12 = 0;
    cVar23 = flags.inv_order[0];
    do {
      bVar27 = false;
      poVar15 = poVar17;
      do {
        if (poVar15->oclass == cVar23) {
          if ((qflags & 8U) == 0) {
            if (!bVar27) goto LAB_00212d04;
          }
          else {
            if (bVar27 || (poVar15->owornmask & 0xf077fU) == 0) goto LAB_00212d0a;
LAB_00212d04:
            iVar12 = iVar12 + 1;
          }
          bVar27 = true;
        }
LAB_00212d0a:
        poVar15 = *(obj **)((long)poVar15->oextra + (uVar26 - 100));
      } while (poVar15 != (obj *)0x0);
      cVar23 = *(char *)(lVar13 + 1);
      lVar13 = lVar13 + 1;
    } while (cVar23 != '\0');
    if ((((qflags & 0x20U) == 0) && ((iVar12 == 1 & local_1b2) != 0)) && (bVar21 < 2)) {
      if ((qflags & 8U) != 0) {
        do {
          if ((poVar17->owornmask & 0xf077fU) != 0) goto LAB_00212fc1;
          poVar17 = *(obj **)((long)poVar17->oextra + (uVar26 - 100));
        } while (poVar17 != (obj *)0x0);
        goto LAB_00212d5c;
      }
LAB_00212fc1:
      *local_198 = (int)poVar17->oclass;
      uVar26 = 1;
      iVar12 = 0;
      results = local_198;
    }
    else {
      init_menulist(&local_1c8);
      cVar23 = 'a';
      if (1 < iVar12 && (qflags & 0x10U) != 0) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        pnVar19 = local_1c8.items + local_1c8.icount;
        pnVar19->id = -2;
        pnVar19->role = MI_NORMAL;
        pnVar19->accel = 'a';
        pnVar19->group_accel = '\0';
        pnVar19->selected = '\0';
        pcVar18 = "All types";
        if ((qflags & 8U) != 0) {
          pcVar18 = "All worn types";
        }
        strcpy(pnVar19->caption,pcVar18);
        local_1c8.icount = local_1c8.icount + 1;
        cVar23 = 'b';
      }
      pcVar18 = flags.inv_order;
      local_1ac = 0;
      do {
        bVar27 = false;
        poVar15 = poVar17;
        do {
          if (poVar15->oclass == *pcVar18) {
            if ((qflags & 8U) == 0) {
              if (!bVar27) goto LAB_00212e4e;
            }
            else {
              if (bVar27 || (poVar15->owornmask & 0xf077fU) == 0) goto LAB_00212f66;
LAB_00212e4e:
              cVar2 = ""[objects[poVar15->otyp].oc_class];
              pcVar14 = let_to_name(poVar15->oclass,'\0');
              sprintf(local_138,"%s  (\'%c\')",pcVar14,(ulong)(uint)(int)cVar2);
              lVar13 = (long)local_1c8.size;
              if (local_1c8.size <= local_1c8.icount) {
                local_1c8.size = local_1c8.size * 2;
                local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
              }
              pnVar19 = local_1c8.items + local_1c8.icount;
              pnVar19->id = (int)poVar15->oclass;
              pnVar19->role = MI_NORMAL;
              pnVar19->accel = cVar23;
              pnVar19->group_accel = '\0';
              pnVar19->selected = '\0';
              strcpy(pnVar19->caption,local_138);
              lVar13 = (long)local_1c8.icount;
              local_1c8.icount = local_1c8.icount + 1;
              local_1c8.items[lVar13].group_accel = cVar2;
              if ((iflags.menu_match_tight != '\0') && (poVar15->oclass != 0xc)) {
                local_188[local_1ac] = (int)poVar15->oclass;
                if (0x10 < local_1ac) {
                  free(local_1c8.items);
                  pcVar18 = "query_category: too many oclasses";
                  goto LAB_00212fe7;
                }
                local_1ac = local_1ac + 1;
              }
              cVar23 = cVar23 + '\x01';
              poVar17 = local_1a8;
            }
            bVar27 = true;
          }
LAB_00212f66:
          pcVar14 = local_190;
          results = local_198;
          iVar3 = local_19c;
          iVar12 = local_1ac;
          poVar15 = *(obj **)((long)poVar15->oextra + (uVar26 - 100));
        } while (poVar15 != (obj *)0x0);
        if ('t' < cVar23) {
          free(local_1c8.items);
          pcVar18 = "query_category: too many categories";
LAB_00212fe7:
          impossible(pcVar18);
          return 0;
        }
        pcVar1 = pcVar18 + 1;
        pcVar18 = pcVar18 + 1;
      } while (*pcVar1 != '\0');
      if (local_1b2 == false) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        lVar13 = (long)local_1c8.icount;
        local_1c8.items[lVar13].id = 0x75;
        local_1c8.items[lVar13].role = MI_NORMAL;
        local_1c8.items[lVar13].accel = 'u';
        local_1c8.items[lVar13].group_accel = '\0';
        local_1c8.items[lVar13].selected = '\0';
        builtin_strncpy(local_1c8.items[lVar13].caption,"Unpaid i",8);
        builtin_strncpy(local_1c8.items[lVar13].caption + 5,"d items",8);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if ((qflags & 0x20U) != 0) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x78;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'x';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Unpaid items alr",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 0xd,"already used up",0x10);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if ((qflags & 0x40U) != 0) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        pnVar19 = local_1c8.items + local_1c8.icount;
        pnVar19->id = 0x41;
        pnVar19->role = MI_NORMAL;
        pnVar19->accel = 'A';
        pnVar19->group_accel = '\0';
        pnVar19->selected = '\0';
        pcVar18 = "Auto-select every item";
        if ((qflags & 8U) != 0) {
          pcVar18 = "Auto-select every item being worn";
        }
        strcpy(pnVar19->caption,pcVar18);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if (local_1af == '\0') {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x49;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'I';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Unidentified Ite",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 0xf,"ems",4);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if (local_1ae == '\0') {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x42;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'B';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Items known to b",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 10,"n to be Blessed",0x10);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if (local_1b1 == false) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x43;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'C';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Items known to b",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 9,"wn to be Cursed",0x10);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if (local_1ad == '\0') {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x55;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'U';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Items known to b",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 0xb," to be Uncursed",0x10);
        local_1c8.icount = local_1c8.icount + 1;
      }
      if (local_1b0 == false) {
        lVar13 = (long)local_1c8.size;
        if (local_1c8.size <= local_1c8.icount) {
          local_1c8.size = local_1c8.size * 2;
          local_1c8.items = (nh_menuitem *)realloc(local_1c8.items,lVar13 * 0x218);
        }
        local_1c8.items[local_1c8.icount].id = 0x58;
        local_1c8.items[local_1c8.icount].role = MI_NORMAL;
        local_1c8.items[local_1c8.icount].accel = 'X';
        local_1c8.items[local_1c8.icount].group_accel = '\0';
        local_1c8.items[local_1c8.icount].selected = '\0';
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption,"Items of unknown",0x10);
        builtin_strncpy(local_1c8.items[local_1c8.icount].caption + 0xe,"wn B/C/U status",0x10);
        local_1c8.icount = local_1c8.icount + 1;
      }
      uVar25 = display_menu(local_1c8.items,local_1c8.icount,pcVar14,iVar3,results);
      free(local_1c8.items);
      uVar26 = 0;
      if (0 < (int)uVar25) {
        uVar26 = (ulong)uVar25;
      }
    }
    uVar25 = (uint)uVar26;
    if ((iflags.menu_match_tight != '\0') && (uVar25 != 0)) {
      bVar27 = 0 < iVar12;
      lVar13 = (long)iVar12;
      uVar20 = 0;
      bVar10 = false;
      bVar8 = false;
      bVar22 = false;
      bVar7 = false;
      bVar4 = false;
LAB_00213429:
      do {
        iVar3 = results[uVar20];
        if ((0 < iVar12) && (!bVar22)) {
          lVar16 = 1;
          do {
            lVar11 = lVar16 + -1;
            if (lVar13 <= lVar16) break;
            lVar16 = lVar16 + 1;
          } while (iVar3 != local_188[lVar11]);
          bVar22 = iVar3 == local_188[lVar11];
        }
        if (iVar3 != 0x61) {
          uVar24 = iVar3 - 0x41;
          if (uVar24 < 0x38) {
            if ((0x90000000900106U >> ((ulong)uVar24 & 0x3f) & 1) == 0) {
              if ((ulong)uVar24 != 0) goto LAB_00213495;
              bVar10 = true;
            }
            else {
              bVar8 = true;
            }
          }
          else {
LAB_00213495:
            if (iVar3 == 0xc) {
              bVar7 = true;
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 == uVar26) {
            if (bVar4) {
              return uVar25;
            }
            if ((!bVar22 && !bVar8) && bVar7) {
              return uVar25;
            }
            bVar9 = !bVar8;
            bVar5 = !bVar7;
            bVar6 = !bVar22;
            bVar4 = !bVar8;
            if ((0x1d < uVar25) && (!bVar22 || (bVar9 || ((bVar5 && bVar6) && bVar4) && bVar10))) {
              pcVar18 = "anything";
              goto LAB_00213528;
            }
            uVar20 = uVar26;
            if (((!bVar7 && !bVar22) && !bVar8) && bVar10) {
              uVar20 = (ulong)(uVar25 + 1);
              results[uVar26] = 0xc;
            }
            uVar24 = (uint)uVar20;
            if (0x1d < (int)uVar24 && (!bVar22 || (bVar9 || ((bVar5 && bVar6) && bVar4) && bVar10)))
            {
              pcVar18 = "COIN_CLASS";
              uVar25 = uVar24;
              goto LAB_00213528;
            }
            if ((((!bVar5 || !bVar6) || !bVar4) || !bVar10) && bVar22) goto LAB_002135cb;
            if ((iVar12 < 1) || (0x1d < (int)uVar24)) goto LAB_002135b4;
            uVar25 = 0x1d - uVar24;
            if (iVar12 - 1U < 0x1d - uVar24) {
              uVar25 = iVar12 - 1U;
            }
            memcpy(results + uVar20,local_188,(ulong)uVar25 * 4 + 4);
            lVar16 = 1;
            uVar26 = uVar20;
            goto LAB_0021359b;
          }
          goto LAB_00213429;
        }
        uVar20 = uVar20 + 1;
        bVar4 = true;
        if (uVar20 == uVar26) {
          return uVar25;
        }
      } while( true );
    }
  }
  return uVar25;
  while (lVar16 = lVar16 + 1, bVar22 = uVar26 < 0x1d, uVar26 = uVar20, bVar22) {
LAB_0021359b:
    uVar20 = uVar26 + 1;
    bVar27 = lVar16 < lVar13;
    if (lVar13 <= lVar16) break;
  }
LAB_002135b4:
  uVar24 = (uint)uVar20;
  if (((int)uVar24 < 0x1e) || (!(bool)((bVar9 || ((bVar5 && bVar6) && bVar4) && bVar10) | bVar27)))
  {
LAB_002135cb:
    if (bVar8) {
      return uVar24;
    }
    uVar25 = uVar24 + 1;
    results[(int)uVar24] = 0x42;
    pcVar18 = "BUCs";
    if ((int)uVar24 < 0x1d) {
      results[(int)uVar25] = 0x43;
      uVar25 = 0x1e;
      if ((uVar24 != 0x1c) && (results[(long)(int)uVar24 + 2] = 0x55, (int)uVar24 < 0x1b)) {
        results[(long)(int)uVar24 + 3] = 0x58;
        return uVar24 + 4;
      }
    }
  }
  else {
    pcVar18 = "oclasses";
    uVar25 = uVar24;
  }
LAB_00213528:
  warning("query_category: no room in pick_list to add %s",pcVar18);
  return uVar25;
}

Assistant:

int query_category(const char *qstr,	/* query string */
		   struct obj *olist,	/* the list to pick from */
		   int qflags,		/* behaviour modification flags */
		   int *pick_list,	/* return list of items picked */
		   int how)		/* type of query */
{
	int n;
	struct obj *curr;
	char *pack;
	boolean collected_type_name;
	char invlet;
	int ccount;
	boolean do_unpaid = FALSE;
	boolean do_blessed = FALSE, do_cursed = FALSE, do_uncursed = FALSE,
	    do_buc_unknown = FALSE, do_unidentified = FALSE;
	int num_buc_types = 0;
	struct menulist menu;
	int valid_oclasses[MAXOCLASSES]; /* excludes COIN_CLASS */
	int num_valid_oclasses = 0;

	if (!olist)
	    return 0;
	if ((qflags & UNPAID_TYPES) && count_unpaid(olist))
	    do_unpaid = TRUE;
	if ((qflags & BUC_BLESSED) && count_buc(olist, BUC_BLESSED)) {
	    do_blessed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_CURSED) && count_buc(olist, BUC_CURSED)) {
	    do_cursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNCURSED) && count_buc(olist, BUC_UNCURSED)) {
	    do_uncursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNKNOWN) && count_buc(olist, BUC_UNKNOWN)) {
	    do_buc_unknown = TRUE;
	    num_buc_types++;
	}
	if ((qflags & UNIDENTIFIED) && count_buc(olist, UNIDENTIFIED))
	    do_unidentified = TRUE;

	ccount = count_categories(olist, qflags);
	/* no point in actually showing a menu for a single category */
	if (ccount == 1 && !do_unpaid && num_buc_types <= 1 &&
	    !(qflags & BILLED_TYPES)) {
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if ((qflags & WORN_TYPES) &&
		    !(curr->owornmask & (W_ARMOR|W_RING|W_AMUL|W_TOOL|W_WEP|W_SWAPWEP|W_QUIVER)))
		    continue;
		break;
	    }
	    if (curr) {
		pick_list[0] = curr->oclass;
		n = 1;
		goto fudge_choices;
	    }
	    return 0;
	}
	
	init_menulist(&menu);

	pack = flags.inv_order;
	invlet = 'a';
	if ((qflags & ALL_TYPES) && (ccount > 1)) {
		add_menuitem(&menu, ALL_TYPES_SELECTED, (qflags & WORN_TYPES) ?
		             "All worn types" : "All types", invlet, FALSE);
		invlet = 'b';
	}
	
	do {
	    collected_type_name = FALSE;
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if (curr->oclass == *pack) {
		   if ((qflags & WORN_TYPES) &&
		   		!(curr->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL |
		    	W_WEP | W_SWAPWEP | W_QUIVER)))
			 continue;
		   if (!collected_type_name) {
			char oc_sym, buf[BUFSZ];
			oc_sym = def_oc_syms[(int)objects[curr->otyp].oc_class];
			sprintf(buf, "%s  ('%c')", let_to_name(*pack, FALSE), oc_sym);
			add_menuitem(&menu, curr->oclass, buf, invlet++, FALSE);
			menu.items[menu.icount - 1].group_accel = oc_sym;
			collected_type_name = TRUE;
			/* Gold is handled separately. */
			if (iflags.menu_match_tight && curr->oclass != COIN_CLASS) {
			    valid_oclasses[num_valid_oclasses++] = curr->oclass;
			    if (num_valid_oclasses >= MAXOCLASSES) {
				free(menu.items);
				impossible("query_category: too many oclasses");
				return 0;
			    }
			}
		   }
		}
	    }
	    pack++;
	    if (invlet >= 'u') {
		free(menu.items);
		impossible("query_category: too many categories");
		return 0;
	    }
	} while (*pack);
	/* unpaid items if there are any */
	if (do_unpaid)
	    add_menuitem(&menu, 'u', "Unpaid items", 'u', FALSE);
	
	/* billed items: checked by caller, so always include if BILLED_TYPES */
	if (qflags & BILLED_TYPES)
	    add_menuitem(&menu, 'x', "Unpaid items already used up", 'x', FALSE);
	
	if (qflags & CHOOSE_ALL)
	    add_menuitem(&menu, 'A', (qflags & WORN_TYPES) ?
		    "Auto-select every item being worn" :
		    "Auto-select every item", 'A', FALSE);
	
	if (do_unidentified)
	    add_menuitem(&menu, 'I', "Unidentified Items", 'I', FALSE);
	
	/* items with b/u/c/unknown if there are any */
	if (do_blessed)
	    add_menuitem(&menu, 'B', "Items known to be Blessed", 'B', FALSE);
	
	if (do_cursed)
	    add_menuitem(&menu, 'C', "Items known to be Cursed", 'C', FALSE);
	
	if (do_uncursed)
	    add_menuitem(&menu, 'U', "Items known to be Uncursed", 'U', FALSE);
	
	if (do_buc_unknown)
	    add_menuitem(&menu, 'X', "Items of unknown B/C/U status", 'X', FALSE);
	
	n = display_menu(menu.items, menu.icount, qstr, how, pick_list);
	free(menu.items);
	if (n < 0)
	    n = 0;	/* callers don't expect -1 */

	/*
	 * Fudge menu choices since allow_category() requires at least
	 * an object class and some object property to show anything.
	 *
	 * - Choosing all [a] goes through allow_all(), which skips all of this.
	 * - Choosing gold [$] always shows gold, since it's not subjected
	 *   the usual property checks.
	 * - Choosing only gold [$] excludes all other objects.
	 * - Auto-select all with nothing else includes gold and all objects.
	 * - Choosing classes w/out properties auto-matches any BUC to match
	 *   all objects of that class.
	 * - Choosing properties w/out classes auto-matches all classes to match
	 *   all objects with those properties.
	 */
fudge_choices:
	if (iflags.menu_match_tight && n > 0) {
	    boolean all_chosen = FALSE;
	    boolean gold_chosen = FALSE;
	    boolean oclass_chosen = FALSE;
	    boolean oprop_chosen = FALSE;
	    boolean autosel_chosen = FALSE;
	    boolean add_gold = FALSE;
	    boolean add_oclasses = FALSE;
	    boolean add_bucs = FALSE;
	    const char *failed_at = NULL; /* 30 == hard-coded pick_list[] length */
	    int i, j;

	    /* Analyze menu choices. */
	    for (i = 0; i < n; i++) {
		int pick = pick_list[i];
		for (j = 0; j < num_valid_oclasses && !oclass_chosen; j++) {
		    if (pick == valid_oclasses[j])
			oclass_chosen = TRUE;
		}
		switch (pick) {
		case 'a':
		    all_chosen = TRUE;
		    break;
		case COIN_CLASS:
		    gold_chosen = TRUE;
		    break;
		case 'B': case 'C': case 'U': case 'X':
		case 'u': case 'x': case 'I':
		    oprop_chosen = TRUE;
		    break;
		case 'A':
		    autosel_chosen = TRUE;
		    break;
		}
	    }

	    /* Choosing all [a] means no special fudging is needed. */
	    if (all_chosen)
		return n;

	    /* If only gold is chosen, don't show anything else. */
	    if (gold_chosen && !(oclass_chosen || oprop_chosen))
		return n;

	    if (autosel_chosen && !(gold_chosen || oclass_chosen || oprop_chosen)) {
		/* If only auto-select all is chosen, add everything. */
		add_gold = TRUE;
		add_oclasses = TRUE;
		add_bucs = TRUE;
	    } else {
		/* Add all oclasses if needed. */
		if (!oclass_chosen)
		    add_oclasses = TRUE;
		/* Add all BUCs if no oprops were chosen. */
		if (!oprop_chosen)
		    add_bucs = TRUE;
	    }

	    if (n >= 30 && (add_gold || add_oclasses || add_bucs)) {
		failed_at = "anything";
		goto append_fail;
	    }

	    if (add_gold)
		pick_list[n++] = COIN_CLASS;
	    if (n >= 30 && (add_oclasses || add_bucs)) {
		failed_at = "COIN_CLASS";
		goto append_fail;
	    }

	    if (add_oclasses) {
		for (j = 0; j < num_valid_oclasses && n < 30; j++)
		    pick_list[n++] = valid_oclasses[j];
		if (n >= 30 && (j < num_valid_oclasses || add_bucs)) {
		    failed_at = "oclasses";
		    goto append_fail;
		}
	    }

	    if (add_bucs) {
		pick_list[n++] = 'B';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'C';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'U';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'X';
	    }

append_fail:
	    if (failed_at)
		warning("query_category: no room in pick_list to add %s", failed_at);
	}

	return n;
}